

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockfilter.cpp
# Opt level: O1

void __thiscall
BlockFilter::BlockFilter
          (BlockFilter *this,BlockFilterType filter_type,CBlock *block,CBlockUndo *block_undo)

{
  uint uVar1;
  pointer psVar2;
  element_type *peVar3;
  pointer pCVar4;
  pointer pCVar5;
  pointer pCVar6;
  uint uVar7;
  invalid_argument *this_00;
  CScript *pCVar8;
  CTxOut *txout;
  pointer pCVar9;
  pointer pCVar10;
  CTxUndo *tx_undo;
  pointer pCVar11;
  CTransactionRef *tx;
  pointer psVar12;
  long in_FS_OFFSET;
  ElementSet elements;
  _Hashtable<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::__detail::_Identity,_std::equal_to<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_ByteVectorHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_f8;
  GCSFilter local_a8;
  Params local_68;
  char *local_48;
  CScript *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this->m_filter_type = filter_type;
  CBlockHeader::GetHash(&this->m_block_hash,&block->super_CBlockHeader);
  local_f8._M_buckets._0_4_ = (uint)local_f8._M_buckets & 0xffffff00;
  local_f8.
  super__Hashtable_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__detail::_Identity,_std::equal_to<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_ByteVectorHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  .
  super__Hash_code_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__detail::_Identity,_ByteVectorHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_true>
  .super__Hashtable_ebo_helper<1,_ByteVectorHash,_false>._M_tp.m_k0 = 0;
  local_f8.
  super__Hashtable_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__detail::_Identity,_std::equal_to<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_ByteVectorHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  .
  super__Hash_code_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__detail::_Identity,_ByteVectorHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_true>
  .super__Hashtable_ebo_helper<1,_ByteVectorHash,_false>._M_tp.m_k1 = 0;
  local_f8._M_buckets = (__buckets_ptr)CONCAT44(1,(uint)local_f8._M_buckets);
  GCSFilter::GCSFilter(&this->m_filter,(Params *)&local_f8);
  local_68.m_P = '\0';
  local_68.m_siphash_k0 = 0;
  local_68.m_siphash_k1 = 0;
  local_68.m_M = 1;
  if (this->m_filter_type == BASIC) {
    local_68.m_siphash_k0 = *(uint64_t *)(this->m_block_hash).super_base_blob<256U>.m_data._M_elems;
    local_68.m_siphash_k1 =
         *(uint64_t *)((this->m_block_hash).super_base_blob<256U>.m_data._M_elems + 8);
    local_68.m_P = '\x13';
    local_68.m_M = 0xbfa23;
    ByteVectorHash::ByteVectorHash((ByteVectorHash *)&local_f8);
    local_f8._M_buckets = &local_f8._M_single_bucket;
    local_f8._M_bucket_count = 1;
    local_f8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_f8._M_element_count = 0;
    local_f8._M_rehash_policy._M_max_load_factor = 1.0;
    local_f8._M_rehash_policy._M_next_resize = 0;
    local_f8._M_single_bucket = (__node_base_ptr)0x0;
    psVar12 = (block->vtx).
              super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    psVar2 = (block->vtx).
             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (psVar12 != psVar2) {
      do {
        peVar3 = (psVar12->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
        pCVar4 = (peVar3->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        for (pCVar9 = (peVar3->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                      super__Vector_impl_data._M_start; pCVar9 != pCVar4; pCVar9 = pCVar9 + 1) {
          uVar1 = (pCVar9->scriptPubKey).super_CScriptBase._size;
          uVar7 = uVar1 - 0x1d;
          if (uVar1 < 0x1d) {
            uVar7 = uVar1;
          }
          if (uVar7 != 0) {
            if (uVar1 < 0x1d) {
              pCVar8 = &pCVar9->scriptPubKey;
            }
            else {
              pCVar8 = (CScript *)
                       (pCVar9->scriptPubKey).super_CScriptBase._union.indirect_contents.indirect;
            }
            if ((pCVar8->super_CScriptBase)._union.direct[0] != 'j') {
              local_48 = (char *)((long)&(pCVar8->super_CScriptBase)._union + (long)(int)uVar7);
              local_40 = pCVar8;
              std::
              _Hashtable<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::__detail::_Identity,std::equal_to<std::vector<unsigned_char,std::allocator<unsigned_char>>>,ByteVectorHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              ::
              _M_emplace<prevector<28u,unsigned_char,unsigned_int,int>::const_iterator,prevector<28u,unsigned_char,unsigned_int,int>::const_iterator>
                        ((_Hashtable<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::__detail::_Identity,std::equal_to<std::vector<unsigned_char,std::allocator<unsigned_char>>>,ByteVectorHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                          *)&local_f8,&local_40,&local_48);
            }
          }
        }
        psVar12 = psVar12 + 1;
      } while (psVar12 != psVar2);
    }
    pCVar11 = (block_undo->vtxundo).super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl.
              super__Vector_impl_data._M_start;
    pCVar5 = (block_undo->vtxundo).super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pCVar11 != pCVar5) {
      do {
        pCVar6 = (pCVar11->vprevout).super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        for (pCVar10 = (pCVar11->vprevout).super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.
                       super__Vector_impl_data._M_start; pCVar10 != pCVar6; pCVar10 = pCVar10 + 1) {
          uVar1 = (pCVar10->out).scriptPubKey.super_CScriptBase._size;
          uVar7 = uVar1 - 0x1d;
          if (uVar1 < 0x1d) {
            uVar7 = uVar1;
          }
          if (uVar7 != 0) {
            if (uVar1 < 0x1d) {
              local_40 = &(pCVar10->out).scriptPubKey;
            }
            else {
              local_40 = (CScript *)
                         (pCVar10->out).scriptPubKey.super_CScriptBase._union.indirect_contents.
                         indirect;
            }
            local_48 = (char *)((long)&(local_40->super_CScriptBase)._union + (long)(int)uVar7);
            std::
            _Hashtable<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::__detail::_Identity,std::equal_to<std::vector<unsigned_char,std::allocator<unsigned_char>>>,ByteVectorHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
            ::
            _M_emplace<prevector<28u,unsigned_char,unsigned_int,int>::const_iterator,prevector<28u,unsigned_char,unsigned_int,int>::const_iterator>
                      ((_Hashtable<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::__detail::_Identity,std::equal_to<std::vector<unsigned_char,std::allocator<unsigned_char>>>,ByteVectorHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                        *)&local_f8,&local_40,&local_48);
          }
        }
        pCVar11 = pCVar11 + 1;
      } while (pCVar11 != pCVar5);
    }
    GCSFilter::GCSFilter(&local_a8,&local_68,(ElementSet *)&local_f8);
    (this->m_filter).m_F = local_a8.m_F;
    (this->m_filter).m_params.m_P = local_a8.m_params.m_P;
    *(undefined3 *)&(this->m_filter).m_params.field_0x11 = local_a8.m_params._17_3_;
    (this->m_filter).m_params.m_M = local_a8.m_params.m_M;
    (this->m_filter).m_N = local_a8.m_N;
    *(undefined4 *)&(this->m_filter).field_0x1c = local_a8._28_4_;
    *(undefined4 *)&(this->m_filter).m_params.m_siphash_k0 =
         (undefined4)local_a8.m_params.m_siphash_k0;
    *(undefined4 *)((long)&(this->m_filter).m_params.m_siphash_k0 + 4) =
         local_a8.m_params.m_siphash_k0._4_4_;
    *(undefined4 *)&(this->m_filter).m_params.m_siphash_k1 =
         (undefined4)local_a8.m_params.m_siphash_k1;
    *(undefined4 *)((long)&(this->m_filter).m_params.m_siphash_k1 + 4) =
         local_a8.m_params.m_siphash_k1._4_4_;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
              (&(this->m_filter).m_encoded,&local_a8.m_encoded);
    if (local_a8.m_encoded.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
        .super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_a8.m_encoded.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_a8.m_encoded.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_a8.m_encoded.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    std::
    _Hashtable<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::__detail::_Identity,_std::equal_to<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_ByteVectorHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&local_f8);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return;
    }
  }
  else {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"unknown filter_type");
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
  }
  __stack_chk_fail();
}

Assistant:

BlockFilter::BlockFilter(BlockFilterType filter_type, const CBlock& block, const CBlockUndo& block_undo)
    : m_filter_type(filter_type), m_block_hash(block.GetHash())
{
    GCSFilter::Params params;
    if (!BuildParams(params)) {
        throw std::invalid_argument("unknown filter_type");
    }
    m_filter = GCSFilter(params, BasicFilterElements(block, block_undo));
}